

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Deferred<kj::Function<void_()>_> * __thiscall
kj::PausableReadAsyncIoStream::trackRead
          (Deferred<kj::Function<void_()>_> *__return_storage_ptr__,PausableReadAsyncIoStream *this)

{
  Iface *pIVar1;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  _kjCondition.value = (bool)(this->currentlyReading ^ 1);
  if (this->currentlyReading == false) {
    this->currentlyReading = true;
    pIVar1 = (Iface *)operator_new(0x10);
    pIVar1->_vptr_Iface = (_func_int **)&PTR_operator___0061b560;
    pIVar1[1]._vptr_Iface = (_func_int **)this;
    (__return_storage_ptr__->maybeFunc).ptr.isSet = true;
    (__return_storage_ptr__->maybeFunc).ptr.field_1.value.impl.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::Function<void()>::Impl<kj::PausableReadAsyncIoStream::trackRead()::$_0>>
          ::instance;
    (__return_storage_ptr__->maybeFunc).ptr.field_1.value.impl.ptr = pIVar1;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x16d2,FAILED,"!currentlyReading",
             "_kjCondition,\"only one read is allowed at any one time\"",&_kjCondition,
             (char (*) [41])"only one read is allowed at any one time");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

_::Deferred<kj::Function<void()>> PausableReadAsyncIoStream::trackRead() {
  KJ_REQUIRE(!currentlyReading, "only one read is allowed at any one time");
  currentlyReading = true;
  return kj::defer<kj::Function<void()>>([this]() { currentlyReading = false; });
}